

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::ConstantNamePrefix_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view classname)

{
  bool bVar1;
  int iVar2;
  string *extraout_RAX;
  string *psVar3;
  char *extraout_RDX;
  long lVar4;
  size_type __rlen;
  string_view name;
  string lower;
  string *local_50;
  php *local_48;
  _Alloc_hider local_40;
  
  local_50 = (string *)&local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,classname._M_len,this + classname._M_len,classname._M_str);
  absl::lts_20240722::AsciiStrToLower((string *)&local_50);
  name._M_str = extraout_RDX;
  name._M_len = (size_t)local_50;
  bVar1 = IsReservedName(local_48,name);
  psVar3 = local_50;
  lVar4 = 8;
  do {
    if (local_48 == *(php **)((long)&PTR_typeinfo_00514328 + lVar4)) {
      if (local_48 == (php *)0x0) goto LAB_002eba5e;
      iVar2 = bcmp(psVar3,*(void **)((long)&kValidConstantNames[0]._M_len + lVar4),(size_t)local_48)
      ;
      if (iVar2 == 0) goto LAB_002eba5e;
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 200);
  if (bVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"PB","");
  }
  else {
LAB_002eba5e:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  psVar3 = (string *)&local_40;
  if (local_50 != psVar3) {
    operator_delete(local_50,(ulong)(local_40._M_p + 1));
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

std::string ConstantNamePrefix(absl::string_view classname) {
  bool is_reserved = false;

  std::string lower = absl::AsciiStrToLower(classname);

  is_reserved = IsReservedName(lower);

  for (int i = 0; i < kValidConstantNamesSize; i++) {
    if (lower == kValidConstantNames[i]) {
      is_reserved = false;
      break;
    }
  }

  if (is_reserved) {
    return "PB";
  }

  return "";
}